

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expert_encode.cc
# Opt level: O0

Status * __thiscall
draco::ExpertEncoder::EncodeMeshToBuffer(ExpertEncoder *this,Mesh *m,EncoderBuffer *out_buffer)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pMVar4;
  size_t num;
  EncoderBase<draco::EncoderOptionsBase<int>_> *in_RSI;
  Status *in_RDI;
  EncoderBuffer *in_stack_00000048;
  EncoderOptions *in_stack_00000050;
  PointCloudEncoder *in_stack_00000058;
  int encoding_method;
  unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> encoder;
  Status *_local_status;
  Mesh *in_stack_ffffffffffffff08;
  MeshEdgebreakerEncoder *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  EncoderOptionsBase<int> *in_stack_ffffffffffffff98;
  string local_60 [52];
  uint local_2c;
  
  std::unique_ptr<draco::MeshEncoder,std::default_delete<draco::MeshEncoder>>::
  unique_ptr<std::default_delete<draco::MeshEncoder>,void>
            ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
             in_stack_ffffffffffffff10);
  EncoderBase<draco::EncoderOptionsBase<int>_>::options(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
             ,(allocator<char> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  uVar2 = DracoOptions<int>::GetGlobalInt
                    ((DracoOptions<int> *)in_stack_ffffffffffffff10,
                     (string *)in_stack_ffffffffffffff08,0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  local_2c = uVar2;
  if (uVar2 == 0xffffffff) {
    EncoderBase<draco::EncoderOptionsBase<int>_>::options(in_RSI);
    iVar3 = EncoderOptionsBase<int>::GetSpeed(in_stack_ffffffffffffff98);
    local_2c = (uint)(iVar3 != 10);
  }
  if (local_2c == 1) {
    operator_new(0x88);
    MeshEdgebreakerEncoder::MeshEdgebreakerEncoder(in_stack_ffffffffffffff10);
    std::unique_ptr<draco::MeshEncoder,std::default_delete<draco::MeshEncoder>>::
    unique_ptr<std::default_delete<draco::MeshEncoder>,void>
              ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
               in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
    std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::operator=
              ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
               in_stack_ffffffffffffff10,
               (unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
               in_stack_ffffffffffffff08);
    std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::~unique_ptr
              ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
               in_stack_ffffffffffffff10);
  }
  else {
    operator_new(0x80);
    MeshSequentialEncoder::MeshSequentialEncoder((MeshSequentialEncoder *)in_stack_ffffffffffffff10)
    ;
    std::unique_ptr<draco::MeshEncoder,std::default_delete<draco::MeshEncoder>>::
    unique_ptr<std::default_delete<draco::MeshEncoder>,void>
              ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
               in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
    std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::operator=
              ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
               in_stack_ffffffffffffff10,
               (unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
               in_stack_ffffffffffffff08);
    std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::~unique_ptr
              ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
               in_stack_ffffffffffffff10);
  }
  std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::operator->
            ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)0x15c532);
  MeshEncoder::SetMesh(&in_stack_ffffffffffffff10->super_MeshEncoder,in_stack_ffffffffffffff08);
  std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::operator->
            ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)0x15c556);
  EncoderBase<draco::EncoderOptionsBase<int>_>::options(in_RSI);
  PointCloudEncoder::Encode(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  bVar1 = Status::ok(in_RDI);
  if (bVar1) {
    Status::~Status((Status *)0x15c5ef);
    pMVar4 = std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::
             operator->((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
                        0x15c606);
    in_stack_ffffffffffffff10 =
         (MeshEdgebreakerEncoder *)
         PointCloudEncoder::num_encoded_points(&pMVar4->super_PointCloudEncoder);
    EncoderBase<draco::EncoderOptionsBase<int>_>::set_num_encoded_points
              (in_RSI,(size_t)in_stack_ffffffffffffff10);
    pMVar4 = std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::
             operator->((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
                        0x15c633);
    num = MeshEncoder::num_encoded_faces(pMVar4);
    EncoderBase<draco::EncoderOptionsBase<int>_>::set_num_encoded_faces(in_RSI,num);
    OkStatus();
  }
  std::unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_>::~unique_ptr
            ((unique_ptr<draco::MeshEncoder,_std::default_delete<draco::MeshEncoder>_> *)
             in_stack_ffffffffffffff10);
  return in_RDI;
}

Assistant:

Status ExpertEncoder::EncodeMeshToBuffer(const Mesh &m,
                                         EncoderBuffer *out_buffer) {
#ifdef DRACO_TRANSCODER_SUPPORTED
  // Apply DracoCompressionOptions associated with the mesh.
  DRACO_RETURN_IF_ERROR(ApplyCompressionOptions(m));
#endif  // DRACO_TRANSCODER_SUPPORTED

  std::unique_ptr<MeshEncoder> encoder;
  // Select the encoding method only based on the provided options.
  int encoding_method = options().GetGlobalInt("encoding_method", -1);
  if (encoding_method == -1) {
    // For now select the edgebreaker for all options expect of speed 10
    if (options().GetSpeed() == 10) {
      encoding_method = MESH_SEQUENTIAL_ENCODING;
    } else {
      encoding_method = MESH_EDGEBREAKER_ENCODING;
    }
  }
  if (encoding_method == MESH_EDGEBREAKER_ENCODING) {
    encoder = std::unique_ptr<MeshEncoder>(new MeshEdgebreakerEncoder());
  } else {
    encoder = std::unique_ptr<MeshEncoder>(new MeshSequentialEncoder());
  }
  encoder->SetMesh(m);

  DRACO_RETURN_IF_ERROR(encoder->Encode(options(), out_buffer));

  set_num_encoded_points(encoder->num_encoded_points());
  set_num_encoded_faces(encoder->num_encoded_faces());
  return OkStatus();
}